

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

uint8_t place_tantegel(dw_map *map,int largest,int next)

{
  byte bVar1;
  byte bVar2;
  dw_love_calc *pdVar3;
  dw_border_tile dVar4;
  byte bVar5;
  uint uVar6;
  dw_return_point *pdVar7;
  
  dVar4 = place(map,WARP_TANTEGEL,TILE_CASTLE,largest,next);
  pdVar3 = map->love_calc;
  bVar1 = map->warps_from[4].x;
  bVar2 = map->warps_from[4].y;
  pdVar3->x = bVar1;
  pdVar3->y = bVar2;
  if (bVar2 < 0x77) {
    if (map->tiles[bVar1][(ulong)bVar2 + 1] - 3 < 3) {
      if (bVar2 != 0) goto LAB_001553e0;
      goto LAB_001553fa;
    }
    bVar5 = bVar2 + 1;
    pdVar7 = map->return_point;
    pdVar7->x = bVar1;
  }
  else {
LAB_001553e0:
    uVar6 = bVar2 - 1;
    if (map->tiles[bVar1][uVar6] - 3 < 3) {
LAB_001553fa:
      bVar5 = bVar2;
      if (bVar1 != 0) {
        if (2 < map->tiles[bVar1 - 1][bVar2] - 3) {
          pdVar7 = map->return_point;
          pdVar7->x = (uint8_t)(bVar1 - 1);
          goto LAB_00155466;
        }
        if (0x76 < bVar1) goto LAB_0015546a;
      }
      if (map->tiles[(ulong)bVar1 + 1][bVar2] - 3 < 3) goto LAB_0015546a;
      pdVar7 = map->return_point;
      pdVar7->x = bVar1 + 1;
    }
    else {
      pdVar7 = map->return_point;
      pdVar7->x = bVar1;
      bVar5 = (byte)uVar6;
    }
  }
LAB_00155466:
  pdVar7->y = bVar5;
LAB_0015546a:
  map->meta[4].border = (uint8_t)dVar4;
  return map->walkable[bVar1][bVar2];
}

Assistant:

static uint8_t place_tantegel(dw_map *map, int largest, int next)
{
    int x, y;
    dw_warp *warp;
    dw_border_tile old_tile;

    old_tile = place(map, WARP_TANTEGEL, TILE_CASTLE, largest, next);
    warp = &map->warps_from[WARP_TANTEGEL];
    x = warp->x;
    y = warp->y;

    map->love_calc->x = x;
    map->love_calc->y = y;
    if (y < 119 && tile_is_walkable(map->tiles[x][y+1])) { 
        map->return_point->x = x;
        map->return_point->y = y+1;
    } else if (y > 0 && tile_is_walkable(map->tiles[x][y-1])) { 
        map->return_point->x = x;
        map->return_point->y = y-1;
    } else if (x > 0 && tile_is_walkable(map->tiles[x-1][y])) { 
        map->return_point->x = x-1;
        map->return_point->y = y;
    } else if (x < 119 && tile_is_walkable(map->tiles[x+1][y])) { 
        map->return_point->x = x+1;
        map->return_point->y = y;
    }
    /* do some stuff */
    map->meta[TANTEGEL].border = old_tile;
    return map->walkable[x][y];
}